

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

cilk_fiber * cilk_fiber::allocate_from_thread(void)

{
  cilk_fiber *this;
  cilk_fiber_sysdep *unaff_retaddr;
  cilk_fiber_sysdep *ret;
  void *retmem;
  
  this = (cilk_fiber *)__cilkrts_malloc(0x10942e);
  if (this != (cilk_fiber *)0x0) {
    cilk_fiber_sysdep::cilk_fiber_sysdep(unaff_retaddr,(from_thread_t)((ulong)this >> 0x20));
    init_ref_count(this,2);
    return this;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                ,0x33b,"retmem");
}

Assistant:

cilk_fiber* cilk_fiber::allocate_from_thread()
{
    void* retmem = __cilkrts_malloc(sizeof(cilk_fiber_sysdep));
    CILK_ASSERT(retmem);
    cilk_fiber_sysdep* ret = ::new(retmem) cilk_fiber_sysdep(from_thread);

    // A fiber allocated from a thread begins with a reference count
    // of 2.  The first is for being created, and the second is for
    // being running.
    //
    // Suspending this fiber will decrement the count down to 1.
    ret->init_ref_count(2);

#if SUPPORT_GET_CURRENT_FIBER    
    // We're creating the main fiber for this thread. Set this fiber as the
    // current fiber.
    cilkos_set_tls_cilk_fiber(ret);
#endif
    return ret;
}